

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
GIM_ShapeRetriever::GIM_ShapeRetriever(GIM_ShapeRetriever *this,cbtGImpactShapeInterface *gim_shape)

{
  cbtTriangleShape *pcVar1;
  cbtVector3 *pcVar2;
  int iVar3;
  ChildShapeRetriever *pCVar4;
  
  cbtPolyhedralConvexShape::cbtPolyhedralConvexShape((cbtPolyhedralConvexShape *)&this->m_trishape);
  (this->m_trishape).super_cbtTriangleShape.super_cbtPolyhedralConvexShape.
  super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.m_shapeType = 1;
  (this->m_trishape).super_cbtTriangleShape.m_vertices1[0].m_floats[0] = 0.0;
  (this->m_trishape).super_cbtTriangleShape.m_vertices1[0].m_floats[1] = 0.0;
  pcVar1 = &(this->m_trishape).super_cbtTriangleShape;
  pcVar1->m_vertices1[0].m_floats[2] = 0.0;
  pcVar1->m_vertices1[0].m_floats[3] = 0.0;
  pcVar1 = &(this->m_trishape).super_cbtTriangleShape;
  pcVar1->m_vertices1[1].m_floats[0] = 0.0;
  pcVar1->m_vertices1[1].m_floats[1] = 0.0;
  pcVar2 = (this->m_trishape).super_cbtTriangleShape.m_vertices1;
  pcVar2[1].m_floats[2] = 0.0;
  pcVar2[1].m_floats[3] = 0.0;
  pcVar1 = &(this->m_trishape).super_cbtTriangleShape;
  pcVar1->m_vertices1[1].m_floats[0] = 0.0;
  pcVar1->m_vertices1[1].m_floats[1] = 0.0;
  pcVar2 = (this->m_trishape).super_cbtTriangleShape.m_vertices1;
  pcVar2[1].m_floats[2] = 0.0;
  pcVar2[1].m_floats[3] = 0.0;
  pcVar1 = &(this->m_trishape).super_cbtTriangleShape;
  pcVar1->m_vertices1[2].m_floats[0] = 0.0;
  pcVar1->m_vertices1[2].m_floats[1] = 0.0;
  pcVar2 = (this->m_trishape).super_cbtTriangleShape.m_vertices1;
  pcVar2[2].m_floats[2] = 0.0;
  pcVar2[2].m_floats[3] = 0.0;
  (this->m_trishape).super_cbtTriangleShape.super_cbtPolyhedralConvexShape.
  super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape
       = (_func_int **)&PTR__cbtPolyhedralConvexShape_00b740a0;
  cbtBU_Simplex1to4::cbtBU_Simplex1to4(&(this->m_tetrashape).super_cbtBU_Simplex1to4);
  (this->m_tetrashape).super_cbtBU_Simplex1to4.super_cbtPolyhedralConvexAabbCachingShape.
  super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape._vptr_cbtCollisionShape =
       (_func_int **)&PTR__cbtPolyhedralConvexShape_00b741d0;
  *(undefined4 *)
   &(this->m_tetrashape).super_cbtBU_Simplex1to4.super_cbtPolyhedralConvexAabbCachingShape.
    field_0x74 = 4;
  (this->m_child_retriever)._vptr_ChildShapeRetriever = (_func_int **)&PTR_getChildShape_00b74300;
  (this->m_tri_retriever).super_ChildShapeRetriever._vptr_ChildShapeRetriever =
       (_func_int **)&PTR_getChildShape_00b74338;
  (this->m_tetra_retriever).super_ChildShapeRetriever._vptr_ChildShapeRetriever =
       (_func_int **)&PTR_getChildShape_00b74378;
  this->m_gim_shape = gim_shape;
  iVar3 = (*(gim_shape->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x18]
          )(gim_shape);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(this->m_gim_shape->super_cbtConcaveShape).super_cbtCollisionShape.
              _vptr_cbtCollisionShape[0x19])();
    if ((char)iVar3 == '\0') {
      pCVar4 = &this->m_child_retriever;
    }
    else {
      pCVar4 = &(this->m_tetra_retriever).super_ChildShapeRetriever;
    }
  }
  else {
    pCVar4 = &(this->m_tri_retriever).super_ChildShapeRetriever;
  }
  this->m_current_retriever = pCVar4;
  this->m_current_retriever->m_parent = this;
  return;
}

Assistant:

GIM_ShapeRetriever(const cbtGImpactShapeInterface* gim_shape)
	{
		m_gim_shape = gim_shape;
		//select retriever
		if (m_gim_shape->needsRetrieveTriangles())
		{
			m_current_retriever = &m_tri_retriever;
		}
		else if (m_gim_shape->needsRetrieveTetrahedrons())
		{
			m_current_retriever = &m_tetra_retriever;
		}
		else
		{
			m_current_retriever = &m_child_retriever;
		}

		m_current_retriever->m_parent = this;
	}